

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::PrinterTest_EmitWithIndentAndIgnoredCommentOnFirstLine_Test::
~PrinterTest_EmitWithIndentAndIgnoredCommentOnFirstLine_Test
          (PrinterTest_EmitWithIndentAndIgnoredCommentOnFirstLine_Test *this)

{
  PrinterTest_EmitWithIndentAndIgnoredCommentOnFirstLine_Test *this_local;
  
  ~PrinterTest_EmitWithIndentAndIgnoredCommentOnFirstLine_Test(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(PrinterTest, EmitWithIndentAndIgnoredCommentOnFirstLine) {
  {
    Printer printer(output());
    auto v = printer.WithIndent();
    printer.Emit({{"f1", "x"}, {"f2", "y"}, {"f3", "z"}}, R"cc(
      //~ First line comment.
      class Foo {
        int $f1$, $f2$, $f3$;
      };
    )cc");
  }

  EXPECT_EQ(written(),
            "  class Foo {\n"
            "    int x, y, z;\n"
            "  };\n");
}